

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::Flush(LogMessage *this)

{
  int iVar1;
  LogMessageData *pLVar2;
  size_t sVar3;
  int *piVar4;
  long *plVar5;
  long lVar6;
  code *local_50;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  char original_final_char;
  bool append_newline;
  LogMessage *this_local;
  
  if (((this->data_->has_been_flushed_ & 1U) == 0) &&
     (fLI::FLAGS_minloglevel <= (int)this->data_->severity_)) {
    sVar3 = LogStream::pcount(&this->data_->stream_);
    this->data_->num_chars_to_log_ = sVar3;
    this->data_->num_chars_to_syslog_ =
         this->data_->num_chars_to_log_ - this->data_->num_prefix_chars_;
    l._M_device._7_1_ = this->data_->message_text_[this->data_->num_chars_to_log_ - 1] != '\n';
    l._M_device._6_1_ = '\0';
    if ((bool)l._M_device._7_1_) {
      l._M_device._6_1_ = this->data_->message_text_[this->data_->num_chars_to_log_];
      pLVar2 = this->data_;
      sVar3 = this->data_->num_chars_to_log_;
      this->data_->num_chars_to_log_ = sVar3 + 1;
      pLVar2->message_text_[sVar3] = '\n';
    }
    this->data_->message_text_[this->data_->num_chars_to_log_] = '\0';
    std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)log_mutex);
    local_50 = (code *)this->data_->send_method_;
    plVar5 = (long *)((long)&this->allocated_ + *(long *)&this->data_->field_0x76a8);
    if (((ulong)local_50 & 1) != 0) {
      local_50 = *(code **)(local_50 + *plVar5 + -1);
    }
    (*local_50)(plVar5);
    lVar6 = (long)(int)this->data_->severity_;
    *(long *)(num_messages_ + lVar6 * 8) = *(long *)(num_messages_ + lVar6 * 8) + 1;
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    LogDestination::WaitForSinks(this->data_);
    if ((l._M_device._7_1_ & 1) != 0) {
      this->data_->message_text_[this->data_->num_chars_to_log_ - 1] = l._M_device._6_1_;
    }
    if (this->data_->preserved_errno_ != 0) {
      iVar1 = this->data_->preserved_errno_;
      piVar4 = __errno_location();
      *piVar4 = iVar1;
    }
    this->data_->has_been_flushed_ = true;
  }
  return;
}

Assistant:

void LogMessage::Flush() {
  if (data_->has_been_flushed_ || data_->severity_ < FLAGS_minloglevel) {
    return;
  }

  data_->num_chars_to_log_ = data_->stream_.pcount();
  data_->num_chars_to_syslog_ =
      data_->num_chars_to_log_ - data_->num_prefix_chars_;

  // Do we need to add a \n to the end of this message?
  bool append_newline =
      (data_->message_text_[data_->num_chars_to_log_ - 1] != '\n');
  char original_final_char = '\0';

  // If we do need to add a \n, we'll do it by violating the memory of the
  // ostrstream buffer.  This is quick, and we'll make sure to undo our
  // modification before anything else is done with the ostrstream.  It
  // would be preferable not to do things this way, but it seems to be
  // the best way to deal with this.
  if (append_newline) {
    original_final_char = data_->message_text_[data_->num_chars_to_log_];
    data_->message_text_[data_->num_chars_to_log_++] = '\n';
  }
  data_->message_text_[data_->num_chars_to_log_] = '\0';

  // Prevent any subtle race conditions by wrapping a mutex lock around
  // the actual logging action per se.
  {
    std::lock_guard<std::mutex> l{log_mutex};
    (this->*(data_->send_method_))();
    ++num_messages_[static_cast<int>(data_->severity_)];
  }
  LogDestination::WaitForSinks(data_);

  if (append_newline) {
    // Fix the ostrstream back how it was before we screwed with it.
    // It's 99.44% certain that we don't need to worry about doing this.
    data_->message_text_[data_->num_chars_to_log_ - 1] = original_final_char;
  }

  // If errno was already set before we enter the logging call, we'll
  // set it back to that value when we return from the logging call.
  // It happens often that we log an error message after a syscall
  // failure, which can potentially set the errno to some other
  // values.  We would like to preserve the original errno.
  if (data_->preserved_errno_ != 0) {
    errno = data_->preserved_errno_;
  }

  // Note that this message is now safely logged.  If we're asked to flush
  // again, as a result of destruction, say, we'll do nothing on future calls.
  data_->has_been_flushed_ = true;
}